

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.hpp
# Opt level: O0

void __thiscall VolumeFile::reset(VolumeFile *this)

{
  bool bVar1;
  ulong uVar2;
  __normal_iterator<VolumeFile::StreamDesc_*,_std::vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>_>
  *in_RDI;
  StreamDesc *dataStream;
  iterator __end1;
  iterator __begin1;
  vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_> *__range1;
  vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_> *in_stack_ffffffffffffffc8
  ;
  __normal_iterator<VolumeFile::StreamDesc_*,_std::vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>_>
  local_18;
  __normal_iterator<VolumeFile::StreamDesc_*,_std::vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>_>
  *local_10;
  
  boost::filesystem::path::clear((path *)0x136c3c);
  boost::filesystem::path::clear((path *)0x136c4a);
  boost::filesystem::path::clear((path *)0x136c58);
  uVar2 = std::ifstream::is_open();
  if ((uVar2 & 1) != 0) {
    std::ifstream::close();
  }
  local_10 = in_RDI + 0x4e;
  local_18._M_current =
       (StreamDesc *)
       std::vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>::begin
                 (in_stack_ffffffffffffffc8);
  std::vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>::end
            (in_stack_ffffffffffffffc8);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_RDI,(__normal_iterator<VolumeFile::StreamDesc_*,_std::vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>_>
                                    *)in_stack_ffffffffffffffc8), bVar1) {
    __gnu_cxx::
    __normal_iterator<VolumeFile::StreamDesc_*,_std::vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>_>
    ::operator*(&local_18);
    uVar2 = std::ifstream::is_open();
    if ((uVar2 & 1) != 0) {
      std::ifstream::close();
    }
    __gnu_cxx::
    __normal_iterator<VolumeFile::StreamDesc_*,_std::vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>_>
    ::operator++(&local_18);
  }
  std::vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>::clear
            ((vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_> *)0x136d03);
  in_RDI[0x51]._M_current = (StreamDesc *)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x136d1f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x136d30);
  *(undefined4 *)((long)&in_RDI[0x58]._M_current + 4) = 0;
  *(undefined4 *)&in_RDI[0x58]._M_current = 0;
  *(undefined4 *)((long)&in_RDI[0x59]._M_current + 4) = 0;
  *(undefined4 *)&in_RDI[0x59]._M_current = 0;
  in_RDI[0x5a]._M_current = (StreamDesc *)0x0;
  return;
}

Assistant:

virtual void reset()
	{
		m_origPath.clear();
		m_basePath.clear();
		m_baseName.clear();

		if (m_mainStream.is_open()) {
			m_mainStream.close();
		}

		for (auto& dataStream: m_dataStreams) {
			if (!dataStream.stream.is_open()) {
				continue;
			}
			dataStream.stream.close();
		}
		m_dataStreams.clear();

		m_mainFileSize = 0;

		m_data.clear();
		m_entryTreeOffsets.clear();

		m_nameTreeOffset = m_extTreeOffset = 0;
		m_nodeTreeOffset = m_entryTreeCount = 0;

		m_dataOffset = 0;
	}